

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O1

Container * __thiscall
IceCore::Container::FindPrev(Container *this,udword *entry,FindMode find_mode)

{
  uint uVar1;
  udword *puVar2;
  Container *pCVar3;
  Container *pCVar4;
  uint uVar5;
  Container *pCVar6;
  bool bVar7;
  
  pCVar3 = (Container *)(ulong)this->mCurNbEntries;
  bVar7 = pCVar3 != (Container *)0x0;
  pCVar4 = this;
  if (bVar7) {
    if (*this->mEntries == *entry) {
      bVar7 = true;
      pCVar4 = (Container *)0x0;
    }
    else {
      pCVar6 = (Container *)0x0;
      do {
        if ((Container *)&pCVar3[-1].field_0x17 == pCVar6) {
          bVar7 = (Container *)((long)&pCVar6->mMaxNbEntries + 1) < pCVar3;
          goto LAB_001bf0d9;
        }
        pCVar4 = (Container *)((long)&pCVar6->mMaxNbEntries + 1);
        puVar2 = &pCVar6->mMaxNbEntries;
        pCVar6 = pCVar4;
      } while (this->mEntries[(long)((long)puVar2 + 1)] != *entry);
      bVar7 = pCVar4 < pCVar3;
    }
  }
LAB_001bf0d9:
  if (bVar7) {
    uVar5 = 0;
    if (find_mode == FIND_WRAP) {
      uVar5 = this->mCurNbEntries - 1;
    }
    uVar1 = (int)pCVar4 - 1;
    if ((int)pCVar4 == 0) {
      uVar1 = uVar5;
    }
    *entry = this->mEntries[uVar1];
  }
  return this;
}

Assistant:

Container& Container::FindPrev(udword& entry, FindMode find_mode)
{
	udword Location;
	if(Contains(entry, &Location))
	{
		Location--;
		if(Location==0xffffffff)	Location = find_mode==FIND_WRAP ? mCurNbEntries-1 : 0;
		entry = mEntries[Location];
	}
	return *this;
}